

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O0

int mg_session_read_struct_value(mg_session *session,mg_value *value)

{
  mg_relationship **rel;
  mg_session *in_RSI;
  mg_session *in_RDI;
  mg_node **unaff_retaddr;
  mg_session *in_stack_00000008;
  uint8_t signature;
  uint8_t marker;
  uint8_t *header;
  mg_path **in_stack_00000030;
  mg_session *in_stack_00000038;
  int local_4;
  
  if (in_RDI->in_end < in_RDI->in_cursor + 2) {
    mg_session_set_error(in_RDI,"unexpected end of message");
    local_4 = -6;
  }
  else {
    rel = (mg_relationship **)(in_RDI->in_buffer + in_RDI->in_cursor);
    if (((ulong)*rel & 0xf0) == 0xb0) {
      switch(*(undefined1 *)((long)rel + 1)) {
      case 0x44:
        in_RSI->status = 0xb;
        local_4 = mg_session_read_date(in_RSI,(mg_date **)rel);
        break;
      case 0x45:
        in_RSI->status = 0x11;
        local_4 = mg_session_read_duration(in_RSI,(mg_duration **)rel);
        break;
      case 0x46:
        in_RSI->status = 0xe;
        local_4 = mg_session_read_date_time(in_RSI,(mg_date_time **)rel);
        break;
      default:
        mg_session_set_error(in_RDI,"unsupported value");
        local_4 = -6;
        break;
      case 0x4e:
        in_RSI->status = 7;
        local_4 = mg_session_read_node(in_stack_00000008,unaff_retaddr);
        break;
      case 0x50:
        in_RSI->status = 10;
        local_4 = mg_session_read_path(in_stack_00000038,in_stack_00000030);
        break;
      case 0x52:
        in_RSI->status = 8;
        local_4 = mg_session_read_relationship(in_RSI,rel);
        break;
      case 0x54:
        in_RSI->status = 0xc;
        local_4 = mg_session_read_time(in_RSI,(mg_time **)rel);
        break;
      case 0x58:
        in_RSI->status = 0x12;
        local_4 = mg_session_read_point_2d(in_RSI,(mg_point_2d **)rel);
        break;
      case 0x59:
        in_RSI->status = 0x13;
        local_4 = mg_session_read_point_3d(in_RSI,(mg_point_3d **)rel);
        break;
      case 100:
        in_RSI->status = 0x10;
        local_4 = mg_session_read_local_date_time(in_RSI,(mg_local_date_time **)rel);
        break;
      case 0x66:
        in_RSI->status = 0xf;
        local_4 = mg_session_read_date_time_zone_id(in_RSI,(mg_date_time_zone_id **)rel);
        break;
      case 0x72:
        in_RSI->status = 9;
        local_4 = mg_session_read_unbound_relationship(in_RSI,(mg_unbound_relationship **)rel);
        break;
      case 0x74:
        in_RSI->status = 0xd;
        local_4 = mg_session_read_local_time(in_RSI,(mg_local_time **)rel);
      }
    }
    else {
      mg_session_set_error(in_RDI,"unsupported value");
      local_4 = -6;
    }
  }
  return local_4;
}

Assistant:

int mg_session_read_struct_value(mg_session *session, mg_value *value) {
  if (session->in_cursor + 2 > session->in_end) {
    mg_session_set_error(session, "unexpected end of message");
    return MG_ERROR_DECODING_FAILED;
  }
  uint8_t *header = (uint8_t *)(session->in_buffer + session->in_cursor);
  uint8_t marker = (uint8_t)header[0];
  uint8_t signature = (uint8_t)header[1];

  if ((marker & 0xF0) != MG_MARKER_TINY_STRUCT) {
    mg_session_set_error(session, "unsupported value");
    return MG_ERROR_DECODING_FAILED;
  }

  switch (signature) {
    case MG_SIGNATURE_NODE:
      value->type = MG_VALUE_TYPE_NODE;
      return mg_session_read_node(session, &value->node_v);
    case MG_SIGNATURE_RELATIONSHIP:
      value->type = MG_VALUE_TYPE_RELATIONSHIP;
      return mg_session_read_relationship(session, &value->relationship_v);
    case MG_SIGNATURE_UNBOUND_RELATIONSHIP:
      value->type = MG_VALUE_TYPE_UNBOUND_RELATIONSHIP;
      return mg_session_read_unbound_relationship(
          session, &value->unbound_relationship_v);
    case MG_SIGNATURE_PATH:
      value->type = MG_VALUE_TYPE_PATH;
      return mg_session_read_path(session, &value->path_v);
    case MG_SIGNATURE_DATE:
      value->type = MG_VALUE_TYPE_DATE;
      return mg_session_read_date(session, &value->date_v);
    case MG_SIGNATURE_TIME:
      value->type = MG_VALUE_TYPE_TIME;
      return mg_session_read_time(session, &value->time_v);
    case MG_SIGNATURE_LOCAL_TIME:
      value->type = MG_VALUE_TYPE_LOCAL_TIME;
      return mg_session_read_local_time(session, &value->local_time_v);
    case MG_SIGNATURE_DATE_TIME:
      value->type = MG_VALUE_TYPE_DATE_TIME;
      return mg_session_read_date_time(session, &value->date_time_v);
    case MG_SIGNATURE_DATE_TIME_ZONE_ID:
      value->type = MG_VALUE_TYPE_DATE_TIME_ZONE_ID;
      return mg_session_read_date_time_zone_id(session,
                                               &value->date_time_zone_id_v);
    case MG_SIGNATURE_LOCAL_DATE_TIME:
      value->type = MG_VALUE_TYPE_LOCAL_DATE_TIME;
      return mg_session_read_local_date_time(session,
                                             &value->local_date_time_v);
    case MG_SIGNATURE_DURATION:
      value->type = MG_VALUE_TYPE_DURATION;
      return mg_session_read_duration(session, &value->duration_v);
    case MG_SIGNATURE_POINT_2D:
      value->type = MG_VALUE_TYPE_POINT_2D;
      return mg_session_read_point_2d(session, &value->point_2d_v);
    case MG_SIGNATURE_POINT_3D:
      value->type = MG_VALUE_TYPE_POINT_3D;
      return mg_session_read_point_3d(session, &value->point_3d_v);
  }

  mg_session_set_error(session, "unsupported value");
  return MG_ERROR_DECODING_FAILED;
}